

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O3

bool __thiscall
prometheus::Registry::NameExistsInOtherType<prometheus::Info>(Registry *this,string *name)

{
  unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
  *puVar1;
  unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>
  *puVar2;
  unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>
  *puVar3;
  bool bVar4;
  long lVar5;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>_>
  __it;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>_>
  __it_00;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>_>
  __it_01;
  long lVar6;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>_>
  __it_02;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>_>
  __it_03;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>_>
  __it_04;
  
  __it_02._M_current =
       (this->counters_).
       super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->counters_).
           super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar1 - (long)__it_02._M_current;
  if (0 < lVar6 >> 5) {
    lVar5 = (lVar6 >> 5) + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,...Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,___Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)_1_>
                            *)name,__it_02);
      __it._M_current = __it_02._M_current;
      if (bVar4) goto LAB_00124a70;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,...Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,___Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)_1_>
                            *)name,__it_02._M_current + 1);
      __it._M_current = __it_02._M_current + 1;
      if (bVar4) goto LAB_00124a70;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,...Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,___Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)_1_>
                            *)name,__it_02._M_current + 2);
      __it._M_current = __it_02._M_current + 2;
      if (bVar4) goto LAB_00124a70;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,...Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,___Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)_1_>
                            *)name,__it_02._M_current + 3);
      __it._M_current = __it_02._M_current + 3;
      if (bVar4) goto LAB_00124a70;
      __it_02._M_current = __it_02._M_current + 4;
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x20;
    } while (1 < lVar5);
  }
  lVar6 = lVar6 >> 3;
  if (lVar6 == 1) {
LAB_00124a5c:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,...Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)#1}>
            ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,___Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)_1_>
                          *)name,__it_02);
    __it._M_current = puVar1;
    if (bVar4) {
      __it._M_current = __it_02._M_current;
    }
  }
  else {
    __it._M_current = __it_02._M_current;
    if (lVar6 == 2) {
LAB_00124a35:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,...Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,___Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)_1_>
                            *)name,__it);
      if (!bVar4) {
        __it_02._M_current = __it._M_current + 1;
        goto LAB_00124a5c;
      }
    }
    else {
      __it._M_current = puVar1;
      if ((lVar6 == 3) &&
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,...Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)#1}>
                  ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,___Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)_1_>
                                *)name,__it_02), __it._M_current = __it_02._M_current, !bVar4)) {
        __it._M_current = __it_02._M_current + 1;
        goto LAB_00124a35;
      }
    }
  }
LAB_00124a70:
  if (__it._M_current !=
      (this->counters_).
      super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return true;
  }
  __it_03._M_current =
       (this->gauges_).
       super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->gauges_).
           super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar2 - (long)__it_03._M_current;
  if (0 < lVar6 >> 5) {
    lVar5 = (lVar6 >> 5) + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                            *)name,__it_03);
      __it_00._M_current = __it_03._M_current;
      if (bVar4) goto LAB_00124b67;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                            *)name,__it_03._M_current + 1);
      __it_00._M_current = __it_03._M_current + 1;
      if (bVar4) goto LAB_00124b67;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                            *)name,__it_03._M_current + 2);
      __it_00._M_current = __it_03._M_current + 2;
      if (bVar4) goto LAB_00124b67;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                            *)name,__it_03._M_current + 3);
      __it_00._M_current = __it_03._M_current + 3;
      if (bVar4) goto LAB_00124b67;
      __it_03._M_current = __it_03._M_current + 4;
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x20;
    } while (1 < lVar5);
  }
  lVar6 = lVar6 >> 3;
  if (lVar6 == 1) {
LAB_00124b53:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
            ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                          *)name,__it_03);
    __it_00._M_current = puVar2;
    if (bVar4) {
      __it_00._M_current = __it_03._M_current;
    }
  }
  else {
    __it_00._M_current = __it_03._M_current;
    if (lVar6 == 2) {
LAB_00124b2c:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                            *)name,__it_00);
      if (!bVar4) {
        __it_03._M_current = __it_00._M_current + 1;
        goto LAB_00124b53;
      }
    }
    else {
      __it_00._M_current = puVar2;
      if ((lVar6 == 3) &&
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)#1}>
                  ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Gauge>,std::default_delete<prometheus::Family<prometheus::Gauge>>>const&)_1_>
                                *)name,__it_03), __it_00._M_current = __it_03._M_current, !bVar4)) {
        __it_00._M_current = __it_03._M_current + 1;
        goto LAB_00124b2c;
      }
    }
  }
LAB_00124b67:
  if (__it_00._M_current !=
      (this->gauges_).
      super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Gauge>,_std::default_delete<prometheus::Family<prometheus::Gauge>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return true;
  }
  __it_04._M_current =
       (this->histograms_).
       super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->histograms_).
           super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar3 - (long)__it_04._M_current;
  if (0 < lVar6 >> 5) {
    lVar5 = (lVar6 >> 5) + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)_1_>
                            *)name,__it_04);
      __it_01._M_current = __it_04._M_current;
      if (bVar4) goto LAB_00124c5e;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)_1_>
                            *)name,__it_04._M_current + 1);
      __it_01._M_current = __it_04._M_current + 1;
      if (bVar4) goto LAB_00124c5e;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)_1_>
                            *)name,__it_04._M_current + 2);
      __it_01._M_current = __it_04._M_current + 2;
      if (bVar4) goto LAB_00124c5e;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)#1}>
              ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)_1_>
                            *)name,__it_04._M_current + 3);
      __it_01._M_current = __it_04._M_current + 3;
      if (bVar4) goto LAB_00124c5e;
      __it_04._M_current = __it_04._M_current + 4;
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x20;
    } while (1 < lVar5);
  }
  lVar6 = lVar6 >> 3;
  if (lVar6 != 1) {
    __it_01._M_current = __it_04._M_current;
    if (lVar6 != 2) {
      __it_01._M_current = puVar3;
      if ((lVar6 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)#1}>
                  ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)_1_>
                                *)name,__it_04), __it_01._M_current = __it_04._M_current, bVar4))
      goto LAB_00124c5e;
      __it_01._M_current = __it_04._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)#1}>
            ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)_1_>
                          *)name,__it_01);
    if (bVar4) goto LAB_00124c5e;
    __it_04._M_current = __it_01._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)#1}>
          ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>>>const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Histogram>,std::default_delete<prometheus::Family<prometheus::Histogram>>>const&)_1_>
                        *)name,__it_04);
  __it_01._M_current = puVar3;
  if (bVar4) {
    __it_01._M_current = __it_04._M_current;
  }
LAB_00124c5e:
  if (__it_01._M_current !=
      (this->histograms_).
      super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Histogram>,_std::default_delete<prometheus::Family<prometheus::Histogram>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return true;
  }
  bVar4 = (anonymous_namespace)::
          FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>
                    (name,&this->summaries_);
  return bVar4;
}

Assistant:

bool Registry::NameExistsInOtherType<Info>(const std::string& name) const {
  return FamilyNameExists(name, counters_, gauges_, histograms_, summaries_);
}